

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

int imagetotif(opj_image_t *image,char *outfile)

{
  uint uVar1;
  OPJ_UINT32 OVar2;
  convert_32s_PXCX p_Var3;
  long lVar4;
  size_t __size;
  OPJ_BYTE *pOVar5;
  OPJ_INT32 *__ptr;
  ulong uVar6;
  OPJ_INT32 local_b4;
  convert_32sXXx_C1R local_a8;
  convert_32sXXx_C1R cvt32sToTif;
  convert_32s_PXCX cvtPxToCx;
  OPJ_INT32 *planes [4];
  OPJ_INT32 *buffer32s;
  OPJ_UINT32 numcomps;
  OPJ_UINT32 i;
  int64_t TIFF_MAX;
  int64_t rowStride;
  int64_t strip_size;
  int sgnd;
  int adjust;
  uint16 tiPhoto;
  uint16 bps;
  uint32 height;
  uint32 width;
  tdata_t buf;
  TIFF *tif;
  char *outfile_local;
  opj_image_t *image_local;
  
  local_a8 = (convert_32sXXx_C1R)0x0;
  sgnd._2_2_ = (ushort)image->comps->prec;
  cvtPxToCx = (convert_32s_PXCX)image->comps->data;
  buffer32s._0_4_ = image->numcomps;
  if (image->color_space == OPJ_CLRSPC_CMYK) {
    if ((uint)buffer32s < 4) {
      fprintf(_stderr,"imagetotif: CMYK images shall be composed of at least 4 planes.\n");
      fprintf(_stderr,"\tAborting\n");
      return 1;
    }
    sgnd._0_2_ = 5;
    if (4 < (uint)buffer32s) {
      buffer32s._0_4_ = 4;
    }
  }
  else if ((uint)buffer32s < 3) {
    sgnd._0_2_ = 1;
  }
  else {
    sgnd._0_2_ = 2;
    if (4 < (uint)buffer32s) {
      buffer32s._0_4_ = 4;
    }
  }
  buffer32s._4_4_ = 1;
  while ((((buffer32s._4_4_ < (uint)buffer32s &&
           (image->comps->dx == image->comps[buffer32s._4_4_].dx)) &&
          (image->comps->dy == image->comps[buffer32s._4_4_].dy)) &&
         ((image->comps->prec == image->comps[buffer32s._4_4_].prec &&
          (image->comps->sgnd == image->comps[buffer32s._4_4_].sgnd))))) {
    planes[(ulong)buffer32s._4_4_ - 1] = image->comps[buffer32s._4_4_].data;
    buffer32s._4_4_ = buffer32s._4_4_ + 1;
  }
  if (buffer32s._4_4_ == (uint)buffer32s) {
    if (0x10 < sgnd._2_2_) {
      sgnd._2_2_ = 0;
    }
    if (sgnd._2_2_ == 0) {
      fprintf(_stderr,"imagetotif: Bits=%d, Only 1 to 16 bits implemented\n",0);
      fprintf(_stderr,"\tAborting\n");
      image_local._4_4_ = 1;
    }
    else {
      lVar4 = TIFFOpen(outfile,"wb");
      if (lVar4 == 0) {
        fprintf(_stderr,"imagetotif:failed to open %s for writing\n",outfile);
        image_local._4_4_ = 1;
      }
      else {
        for (buffer32s._4_4_ = 0; buffer32s._4_4_ < (uint)buffer32s;
            buffer32s._4_4_ = buffer32s._4_4_ + 1) {
          clip_component(image->comps + buffer32s._4_4_,image->comps->prec);
        }
        p_Var3 = convert_32s_PXCX_LUT[(uint)buffer32s];
        switch(sgnd._2_2_) {
        case 1:
        case 2:
        case 4:
        case 6:
        case 8:
          local_a8 = convert_32sXXu_C1R_LUT[sgnd._2_2_];
          break;
        case 3:
          local_a8 = tif_32sto3u;
          break;
        case 5:
          local_a8 = tif_32sto5u;
          break;
        case 7:
          local_a8 = tif_32sto7u;
          break;
        case 9:
          local_a8 = tif_32sto9u;
          break;
        case 10:
          local_a8 = tif_32sto10u;
          break;
        case 0xb:
          local_a8 = tif_32sto11u;
          break;
        case 0xc:
          local_a8 = tif_32sto12u;
          break;
        case 0xd:
          local_a8 = tif_32sto13u;
          break;
        case 0xe:
          local_a8 = tif_32sto14u;
          break;
        case 0xf:
          local_a8 = tif_32sto15u;
          break;
        case 0x10:
          local_a8 = tif_32sto16u;
        }
        if (image->comps->sgnd == 0) {
          local_b4 = 0;
        }
        else {
          local_b4 = 1 << ((char)image->comps->prec - 1U & 0x1f);
        }
        uVar1 = image->comps->w;
        OVar2 = image->comps->h;
        TIFFSetField(lVar4,0x100,uVar1);
        TIFFSetField(lVar4,0x101,OVar2);
        TIFFSetField(lVar4,0x115,(uint)buffer32s & 0xffff);
        TIFFSetField(lVar4,0x102,sgnd._2_2_);
        TIFFSetField(lVar4,0x112,1);
        TIFFSetField(lVar4,0x11c,1);
        TIFFSetField(lVar4,0x106,(undefined2)sgnd);
        TIFFSetField(lVar4,0x116,1);
        __size = TIFFStripSize(lVar4);
        uVar6 = 0xffffffff % (ulong)(uint)buffer32s;
        if (((0xffffffff / (ulong)(uint)buffer32s < (ulong)uVar1) ||
            (uVar6 = 0xffffffff % (ulong)sgnd._2_2_,
            0xffffffff / (ulong)sgnd._2_2_ < (ulong)(uVar1 * (uint)buffer32s))) ||
           (uVar6 = 3, 0x3fffffff < uVar1 * (uint)buffer32s)) {
          fprintf(_stderr,"Buffer overflow\n",uVar6);
          TIFFClose(lVar4);
          image_local._4_4_ = 1;
        }
        else if (uVar1 * (uint)buffer32s * (uint)sgnd._2_2_ + 7 >> 3 == __size) {
          pOVar5 = (OPJ_BYTE *)malloc(__size);
          if (pOVar5 == (OPJ_BYTE *)0x0) {
            TIFFClose(lVar4);
            image_local._4_4_ = 1;
          }
          else {
            __ptr = (OPJ_INT32 *)malloc((ulong)uVar1 * 4 * (ulong)(uint)buffer32s);
            if (__ptr == (OPJ_INT32 *)0x0) {
              _TIFFfree(pOVar5);
              TIFFClose(lVar4);
              image_local._4_4_ = 1;
            }
            else {
              for (buffer32s._4_4_ = 0; buffer32s._4_4_ < image->comps->h;
                  buffer32s._4_4_ = buffer32s._4_4_ + 1) {
                (*p_Var3)((OPJ_INT32 **)&cvtPxToCx,__ptr,(OPJ_SIZE_T)uVar1,local_b4);
                (*local_a8)(__ptr,pOVar5,(ulong)uVar1 * (ulong)(uint)buffer32s);
                TIFFWriteEncodedStrip(lVar4,buffer32s._4_4_,pOVar5,__size);
                cvtPxToCx = cvtPxToCx + (ulong)uVar1 * 4;
                planes[0] = planes[0] + uVar1;
                planes[1] = planes[1] + uVar1;
                planes[2] = planes[2] + uVar1;
              }
              _TIFFfree(pOVar5);
              TIFFClose(lVar4);
              free(__ptr);
              image_local._4_4_ = 0;
            }
          }
        }
        else {
          fprintf(_stderr,"Invalid TIFF strip size\n",3);
          TIFFClose(lVar4);
          image_local._4_4_ = 1;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"imagetotif: All components shall have the same subsampling, same bit depth.\n")
    ;
    fprintf(_stderr,"\tAborting\n");
    image_local._4_4_ = 1;
  }
  return image_local._4_4_;
}

Assistant:

int imagetotif(opj_image_t * image, const char *outfile)
{
    TIFF *tif;
    tdata_t buf;
    uint32 width, height;
    uint16 bps, tiPhoto;
    int adjust, sgnd;
    int64_t strip_size, rowStride, TIFF_MAX;
    OPJ_UINT32 i, numcomps;
    OPJ_INT32* buffer32s = NULL;
    OPJ_INT32 const* planes[4];
    convert_32s_PXCX cvtPxToCx = NULL;
    convert_32sXXx_C1R cvt32sToTif = NULL;

    bps = (uint16)image->comps[0].prec;
    planes[0] = image->comps[0].data;

    numcomps = image->numcomps;

    if (image->color_space == OPJ_CLRSPC_CMYK) {
        if (numcomps < 4U) {
            fprintf(stderr,
                    "imagetotif: CMYK images shall be composed of at least 4 planes.\n");
            fprintf(stderr, "\tAborting\n");
            return 1;
        }
        tiPhoto = PHOTOMETRIC_SEPARATED;
        if (numcomps > 4U) {
            numcomps = 4U; /* Alpha not supported */
        }
    } else if (numcomps > 2U) {
        tiPhoto = PHOTOMETRIC_RGB;
        if (numcomps > 4U) {
            numcomps = 4U;
        }
    } else {
        tiPhoto = PHOTOMETRIC_MINISBLACK;
    }
    for (i = 1U; i < numcomps; ++i) {
        if (image->comps[0].dx != image->comps[i].dx) {
            break;
        }
        if (image->comps[0].dy != image->comps[i].dy) {
            break;
        }
        if (image->comps[0].prec != image->comps[i].prec) {
            break;
        }
        if (image->comps[0].sgnd != image->comps[i].sgnd) {
            break;
        }
        planes[i] = image->comps[i].data;
    }
    if (i != numcomps) {
        fprintf(stderr,
                "imagetotif: All components shall have the same subsampling, same bit depth.\n");
        fprintf(stderr, "\tAborting\n");
        return 1;
    }

    if (bps > 16) {
        bps = 0;
    }
    if (bps == 0) {
        fprintf(stderr, "imagetotif: Bits=%d, Only 1 to 16 bits implemented\n", bps);
        fprintf(stderr, "\tAborting\n");
        return 1;
    }
    tif = TIFFOpen(outfile, "wb");
    if (!tif) {
        fprintf(stderr, "imagetotif:failed to open %s for writing\n", outfile);
        return 1;
    }
    for (i = 0U; i < numcomps; ++i) {
        clip_component(&(image->comps[i]), image->comps[0].prec);
    }
    cvtPxToCx = convert_32s_PXCX_LUT[numcomps];
    switch (bps) {
    case 1:
    case 2:
    case 4:
    case 6:
    case 8:
        cvt32sToTif = convert_32sXXu_C1R_LUT[bps];
        break;
    case 3:
        cvt32sToTif = tif_32sto3u;
        break;
    case 5:
        cvt32sToTif = tif_32sto5u;
        break;
    case 7:
        cvt32sToTif = tif_32sto7u;
        break;
    case 9:
        cvt32sToTif = tif_32sto9u;
        break;
    case 10:
        cvt32sToTif = tif_32sto10u;
        break;
    case 11:
        cvt32sToTif = tif_32sto11u;
        break;
    case 12:
        cvt32sToTif = tif_32sto12u;
        break;
    case 13:
        cvt32sToTif = tif_32sto13u;
        break;
    case 14:
        cvt32sToTif = tif_32sto14u;
        break;
    case 15:
        cvt32sToTif = tif_32sto15u;
        break;
    case 16:
        cvt32sToTif = (convert_32sXXx_C1R)tif_32sto16u;
        break;
    default:
        /* never here */
        break;
    }
    sgnd = (int)image->comps[0].sgnd;
    adjust = sgnd ? (int)(1 << (image->comps[0].prec - 1)) : 0;
    width   = (uint32)image->comps[0].w;
    height  = (uint32)image->comps[0].h;

    TIFFSetField(tif, TIFFTAG_IMAGEWIDTH, width);
    TIFFSetField(tif, TIFFTAG_IMAGELENGTH, height);
    TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, (uint16)numcomps);
    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, bps);
    TIFFSetField(tif, TIFFTAG_ORIENTATION, ORIENTATION_TOPLEFT);
    TIFFSetField(tif, TIFFTAG_PLANARCONFIG, PLANARCONFIG_CONTIG);
    TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, tiPhoto);
    TIFFSetField(tif, TIFFTAG_ROWSPERSTRIP, 1);
    if (sizeof(tsize_t) == 4) {
        TIFF_MAX = INT_MAX;
    } else {
        TIFF_MAX = UINT_MAX;
    }
    strip_size = (int64_t)TIFFStripSize(tif);

    if ((int64_t)width > (int64_t)(TIFF_MAX / numcomps) ||
            (int64_t)(width * numcomps) > (int64_t)(TIFF_MAX / bps) ||
            (int64_t)(width * numcomps) > (int64_t)(TIFF_MAX / (int64_t)sizeof(
                        OPJ_INT32))) {
        fprintf(stderr, "Buffer overflow\n");
        TIFFClose(tif);
        return 1;
    }
    rowStride = (int64_t)((width * numcomps * bps + 7U) / 8U);
    if (rowStride != strip_size) {
        fprintf(stderr, "Invalid TIFF strip size\n");
        TIFFClose(tif);
        return 1;
    }
    buf = malloc((OPJ_SIZE_T)strip_size);
    if (buf == NULL) {
        TIFFClose(tif);
        return 1;
    }
    buffer32s = (OPJ_INT32 *)malloc(sizeof(OPJ_INT32) * width * numcomps);
    if (buffer32s == NULL) {
        _TIFFfree(buf);
        TIFFClose(tif);
        return 1;
    }

    for (i = 0; i < image->comps[0].h; ++i) {
        cvtPxToCx(planes, buffer32s, (OPJ_SIZE_T)width, adjust);
        cvt32sToTif(buffer32s, (OPJ_BYTE *)buf, (OPJ_SIZE_T)width * numcomps);
        (void)TIFFWriteEncodedStrip(tif, i, (void*)buf, (tsize_t)strip_size);
        planes[0] += width;
        planes[1] += width;
        planes[2] += width;
        planes[3] += width;
    }
    _TIFFfree((void*)buf);
    TIFFClose(tif);
    free(buffer32s);

    return 0;
}